

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2psf1.cpp
# Opt level: O3

bool bin2psf1(char *bin_path,char *psf_path,uint32_t load_address,uint32_t initial_pc,
             uint32_t initial_sp,char *region_name,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *tags)

{
  ulong uVar1;
  ZlibWriter exe_z;
  char region_marker [256];
  
  uVar1 = (ulong)(load_address | 0x80000000);
  if (0xffffff < load_address) {
    uVar1 = (ulong)load_address;
  }
  fprintf(_stderr,"Error: Invalid load address 0x%08X\n",uVar1);
  return false;
}

Assistant:

bool bin2psf1(const char * bin_path, const char * psf_path, uint32_t load_address, uint32_t initial_pc, uint32_t initial_sp, const char * region_name, std::map<std::string, std::string> tags)
{
	uint32_t load_offset = load_address & 0xffffff;

	if ((load_address >> 24) == 0) {
		load_address |= 0x80000000;
	}

	if ((load_address >> 24) != 0x80 || load_offset >= MAX_PSX_ROM_SIZE) {
		fprintf(stderr, "Error: Invalid load address 0x%08X\n", load_address);
		return false;
	}

	off_t bin_size = path_getfilesize(bin_path);
	if (bin_size == -1) {
		fprintf(stderr, "Error: File size error \"%s\"\n", bin_path);
		return false;
	}

	if (bin_size > MAX_PSX_ROM_SIZE) {
		fprintf(stderr, "Error: File too large \"%s\"\n", bin_path);
		return false;
	}

	uint32_t load_size = (uint32_t)bin_size;
	load_size = (load_size + PSX_ROM_ALIGN_SIZE - 1) / PSX_ROM_ALIGN_SIZE * PSX_ROM_ALIGN_SIZE;

	if (load_offset + load_size > MAX_PSX_ROM_SIZE) {
		fprintf(stderr, "Error: Address out of range (0x%08X + 0x%X) \"%s\"\n", load_address, load_size, bin_path);
		return false;
	}

	uint8_t * exe = new uint8_t[PSF_EXE_HEADER_SIZE + load_size];
	if (exe == NULL) {
		fprintf(stderr, "Error: Unable to allocate memory\n");
		return false;
	}
	memset(exe, 0, PSF_EXE_HEADER_SIZE + load_size);

	// Read input file
	FILE * bin_file = fopen(bin_path, "rb");
	if (bin_file == NULL) {
		fprintf(stderr, "Error: Unable to open file \"%s\"\n", bin_path);
		delete[] exe;
		return false;
	}

	if (fread(&exe[PSF_EXE_HEADER_SIZE], 1, bin_size, bin_file) != bin_size) {
		fprintf(stderr, "Error: File read error \"%s\"\n", bin_path);
		fclose(bin_file);
		delete[] exe;
		return false;
	}

	fclose(bin_file);

	// Construct PSX-EXE header
	char region_marker[256];
	if (region_name == NULL || region_name[0] == '\0') {
		region_name = "North America";
	}
	sprintf(region_marker, "Sony Computer Entertainment Inc. for %s area", region_name);

	memcpy(exe, "PS-X EXE", 8);
	mput4l(initial_pc, &exe[0x10]);
	mput4l(load_address, &exe[0x18]);
	mput4l(load_size, &exe[0x1c]);
	mput4l(initial_sp, &exe[0x30]);
	strcpy((char *)(&exe[0x4c]), region_marker);

	// Write to PSF1 file
	ZlibWriter exe_z(Z_BEST_COMPRESSION);
	if (exe_z.write(exe, PSF_EXE_HEADER_SIZE + load_size) != PSF_EXE_HEADER_SIZE + load_size) {
		fprintf(stderr, "Error: Zlib compress error \"%s\"\n", psf_path);
		delete[] exe;
		return false;
	}
	if (!PSFFile::save(psf_path, PSF1_PSF_VERSION, NULL, 0, exe_z, tags)) {
		fprintf(stderr, "Error: File write error \"%s\"\n", psf_path);
		delete[] exe;
		return false;
	}

	delete[] exe;
	return true;
}